

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O0

bool Cipher::encryptExact(TParameters *param_1,string *text,TClusters *clusters)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint *puVar4;
  vector<int,_std::allocator<int>_> *this;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  vector<int,_std::allocator<int>_> *in_RDX;
  ulong in_RSI;
  int i_1;
  int i;
  vector<int,_std::allocator<int>_> alphabetTransformation;
  char *p;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  int k;
  array<int,_256UL> myCharToLetter;
  undefined4 in_stack_fffffffffffffb38;
  int in_stack_fffffffffffffb3c;
  uint in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb44;
  int iVar8;
  allocator_type *in_stack_fffffffffffffb50;
  THint *hint;
  int in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb5c;
  int local_48c;
  THint local_488;
  int local_470;
  vector<int,_std::allocator<int>_> local_458;
  reference local_440;
  undefined8 local_438;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_430;
  ulong local_428;
  uint local_41c;
  undefined1 local_418 [1024];
  vector<int,_std::allocator<int>_> *local_18;
  ulong local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  memcpy(local_418,&DAT_002683a0,0x400);
  local_41c = 0x1b;
  local_428 = local_10;
  local_430._M_current = (char *)std::__cxx11::string::begin();
  local_438 = std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    if (!bVar1) break;
    local_440 = __gnu_cxx::
                __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(&local_430);
    pvVar7 = std::array<int,_256UL>::operator[]
                       ((array<int,_256UL> *)
                        CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                        CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    if (*pvVar7 == 0) {
      uVar2 = local_41c + 1;
      local_41c = uVar2;
      puVar4 = (uint *)std::array<int,_256UL>::operator[]
                                 ((array<int,_256UL> *)
                                  CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                                  CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      *puVar4 = uVar2;
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_430);
  }
  printf("[encryptExact] Unique symbols = %d\n",(ulong)local_41c);
  this = (vector<int,_std::allocator<int>_> *)(long)(int)local_41c;
  std::allocator<int>::allocator((allocator<int> *)0x1b7cc4);
  std::vector<int,_std::allocator<int>_>::vector
            (this,CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
             in_stack_fffffffffffffb50);
  std::allocator<int>::~allocator((allocator<int> *)0x1b7ce4);
  local_470 = 0;
  while( true ) {
    iVar8 = local_470;
    sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_458);
    if ((int)sVar5 <= iVar8) break;
    in_stack_fffffffffffffb58 = local_470;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_458,(long)local_470);
    *pvVar6 = in_stack_fffffffffffffb58;
    local_470 = local_470 + 1;
  }
  local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  hint = &local_488;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1b7d70);
  (anonymous_namespace)::shuffle<std::vector<int,std::allocator<int>>>
            (this,iVar8,in_stack_fffffffffffffb58,hint);
  std::vector<int,_std::allocator<int>_>::~vector(hint);
  std::__cxx11::string::size();
  std::vector<int,_std::allocator<int>_>::resize(this,CONCAT44(iVar8,in_stack_fffffffffffffb58));
  local_48c = 0;
  while( true ) {
    iVar8 = local_48c;
    iVar3 = std::__cxx11::string::size();
    if (iVar3 <= iVar8) {
      std::vector<int,_std::allocator<int>_>::~vector(hint);
      return true;
    }
    std::__cxx11::string::operator[](local_10);
    pvVar7 = std::array<int,_256UL>::operator[]
                       ((array<int,_256UL> *)CONCAT44(iVar8,in_stack_fffffffffffffb40),
                        CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    if (*pvVar7 < 1) break;
    std::__cxx11::string::operator[](local_10);
    pvVar7 = std::array<int,_256UL>::operator[]
                       ((array<int,_256UL> *)CONCAT44(iVar8,in_stack_fffffffffffffb40),
                        CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_458,(long)(*pvVar7 + -1));
    in_stack_fffffffffffffb3c = *pvVar6 + 1;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](local_18,(long)local_48c);
    *pvVar6 = in_stack_fffffffffffffb3c;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](local_18,(long)local_48c);
    in_stack_fffffffffffffb40 = in_stack_fffffffffffffb40 & 0xffffff;
    if (0 < *pvVar6) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](local_18,(long)local_48c);
      in_stack_fffffffffffffb40 =
           CONCAT13(*pvVar6 <= (int)local_41c,(int3)in_stack_fffffffffffffb40);
    }
    if ((char)(in_stack_fffffffffffffb40 >> 0x18) == '\0') {
      __assert_fail("clusters[i] > 0 && clusters[i] <= k",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/subbreak3.cpp"
                    ,0x24b,
                    "bool Cipher::encryptExact(const TParameters &, const std::string &, TClusters &)"
                   );
    }
    local_48c = local_48c + 1;
  }
  __assert_fail("myCharToLetter[text[i]] > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/subbreak3.cpp"
                ,0x249,
                "bool Cipher::encryptExact(const TParameters &, const std::string &, TClusters &)");
}

Assistant:

bool encryptExact(const TParameters & , const std::string & text, TClusters & clusters) {
        auto myCharToLetter = kCharToLetter;

		int k = 27;
        {
            for (auto & p : text) {
                if (myCharToLetter[p] == 0) {
                    myCharToLetter[p] = ++k;
                }
            }
            printf("[encryptExact] Unique symbols = %d\n", k);
        }

		std::vector<TClusterId> alphabetTransformation(k);
		for (int i = 0; i < (int) alphabetTransformation.size(); ++i) {
			alphabetTransformation[i] = i;
		}

		shuffle(alphabetTransformation);

		clusters.resize(text.size());

		for (int i = 0; i < (int) text.size(); ++i) {
			assert(myCharToLetter[text[i]] > 0);
			clusters[i] = alphabetTransformation[myCharToLetter[text[i]] - 1] + 1;
			assert(clusters[i] > 0 && clusters[i] <= k);
		}

        return true;
    }